

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::DataManWriter::PushBufferQueue
          (DataManWriter *this,shared_ptr<std::vector<char,_std::allocator<char>_>_> *buffer)

{
  queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
  *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,in_RDI);
  std::
  queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::push(in_RSI,(value_type *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xe3d17e);
  return;
}

Assistant:

void DataManWriter::PushBufferQueue(std::shared_ptr<std::vector<char>> buffer)
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    m_BufferQueue.push(buffer);
}